

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::
     log<char_const(&)[36],kj::_::DebugComparison<char_const(&)[5],kj::StringPtr&>&,char_const(&)[5],kj::StringPtr&>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [36],
               DebugComparison<const_char_(&)[5],_kj::StringPtr_&> *params_1,char (*params_2) [5],
               StringPtr *params_3)

{
  ArrayPtr<kj::String> argValues_00;
  undefined4 in_register_00000014;
  DebugComparison<const_char_(&)[5],_kj::StringPtr_&> *params_00;
  char (*params_01) [5];
  StringPtr *params_02;
  long lVar1;
  String *in_stack_ffffffffffffff58;
  String argValues [4];
  
  str<char_const(&)[36]>
            (argValues,(kj *)params,(char (*) [36])CONCAT44(in_register_00000014,severity));
  str<kj::_::DebugComparison<char_const(&)[5],kj::StringPtr&>&>
            (argValues + 1,(kj *)params_1,params_00);
  str<char_const(&)[5]>(argValues + 2,(kj *)params_2,params_01);
  str<kj::StringPtr&>(argValues + 3,(kj *)params_3,params_02);
  argValues_00.size_ = (size_t)macroArgs;
  argValues_00.ptr = in_stack_ffffffffffffff58;
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              (char *)argValues,argValues_00);
  lVar1 = 0x48;
  do {
    Array<char>::~Array((Array<char> *)((long)&argValues[0].content.ptr + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}